

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::Generate
          (ServiceGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  FileDescriptor *pFVar2;
  FileOptions *this_00;
  char *__s;
  int __c;
  FileDescriptor *descriptor;
  string local_98 [32];
  string local_78;
  allocator<char> local_41;
  string local_40 [39];
  byte local_19;
  Printer *pPStack_18;
  bool is_own_file;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  pFVar2 = ServiceDescriptor::file(this->descriptor_);
  this_00 = FileDescriptor::options(pFVar2);
  local_19 = FileOptions::java_multiple_files(this_00);
  WriteServiceDocComment(pPStack_18,this->descriptor_);
  pPVar1 = pPStack_18;
  __s = "static";
  if ((local_19 & 1) != 0) {
    __s = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,&local_41);
  ServiceDescriptor::name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)pPVar1,
             "public $static$ abstract class $classname$\n    implements com.google.protobuf.Service {\n"
             ,(string *)"static",(char *)local_40,(string *)"classname");
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  google::protobuf::io::Printer::Indent();
  pPVar1 = pPStack_18;
  ServiceDescriptor::name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)pPVar1,"protected $classname$() {}\n\n",(string *)"classname");
  GenerateInterface(this,pPStack_18);
  GenerateNewReflectiveServiceMethod(this,pPStack_18);
  GenerateNewReflectiveBlockingServiceMethod(this,pPStack_18);
  GenerateAbstractMethods(this,pPStack_18);
  pPVar1 = pPStack_18;
  pFVar2 = ServiceDescriptor::file(this->descriptor_);
  ClassName_abi_cxx11_(&local_78,(java *)pFVar2,descriptor);
  ServiceDescriptor::index(this->descriptor_,(char *)pFVar2,__c);
  google::protobuf::SimpleItoa_abi_cxx11_((int)local_98);
  google::protobuf::io::Printer::Print
            ((char *)pPVar1,
             "public static final\n    com.google.protobuf.Descriptors.ServiceDescriptor\n    getDescriptor() {\n  return $file$.getDescriptor().getServices().get($index$);\n}\n"
             ,(string *)0x1f3490,(char *)&local_78,(string *)0x1e7ec3);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&local_78);
  GenerateGetDescriptorForType(this,pPStack_18);
  GenerateCallMethod(this,pPStack_18);
  GenerateGetPrototype(this,REQUEST,pPStack_18);
  GenerateGetPrototype(this,RESPONSE,pPStack_18);
  GenerateStub(this,pPStack_18);
  GenerateBlockingStub(this,pPStack_18);
  pPVar1 = pPStack_18;
  ServiceDescriptor::full_name_abi_cxx11_(this->descriptor_);
  google::protobuf::io::Printer::Print
            ((char *)pPVar1,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (string *)0x1e8849);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Print((char *)pPStack_18);
  return;
}

Assistant:

void ServiceGenerator::Generate(io::Printer* printer) {
  bool is_own_file = descriptor_->file()->options().java_multiple_files();
  WriteServiceDocComment(printer, descriptor_);
  printer->Print(
    "public $static$ abstract class $classname$\n"
    "    implements com.google.protobuf.Service {\n",
    "static", is_own_file ? "" : "static",
    "classname", descriptor_->name());
  printer->Indent();

  printer->Print(
    "protected $classname$() {}\n\n",
    "classname", descriptor_->name());

  GenerateInterface(printer);

  GenerateNewReflectiveServiceMethod(printer);
  GenerateNewReflectiveBlockingServiceMethod(printer);

  GenerateAbstractMethods(printer);

  // Generate getDescriptor() and getDescriptorForType().
  printer->Print(
    "public static final\n"
    "    com.google.protobuf.Descriptors.ServiceDescriptor\n"
    "    getDescriptor() {\n"
    "  return $file$.getDescriptor().getServices().get($index$);\n"
    "}\n",
    "file", ClassName(descriptor_->file()),
    "index", SimpleItoa(descriptor_->index()));
  GenerateGetDescriptorForType(printer);

  // Generate more stuff.
  GenerateCallMethod(printer);
  GenerateGetPrototype(REQUEST, printer);
  GenerateGetPrototype(RESPONSE, printer);
  GenerateStub(printer);
  GenerateBlockingStub(printer);

  // Add an insertion point.
  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}